

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.h
# Opt level: O0

int __thiscall poly::degree(poly *this)

{
  int iVar1;
  bool bVar2;
  poly *this_local;
  
  if (this->_degree < 0) {
    iVar1 = bits(this);
    this->_degree = iVar1;
    do {
      this->_degree = this->_degree + -1;
      bVar2 = false;
      if (0 < this->_degree) {
        iVar1 = operator[](this,this->_degree);
        bVar2 = iVar1 == 0;
      }
    } while (bVar2);
    this_local._4_4_ = this->_degree;
  }
  else {
    this_local._4_4_ = this->_degree;
  }
  return this_local._4_4_;
}

Assistant:

int degree() const {
        if (_degree >= 0)
            return _degree;
        _degree = bits();
        do {
            _degree--;
        } while ((_degree > 0) && ((*this)[_degree] == 0));
        return _degree;
    }